

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void __thiscall ImGuiTabBar::ImGuiTabBar(ImGuiTabBar *this)

{
  ImVector<ImGuiTabItem> *in_RDI;
  ImVector<ImGuiTabItem> *this_00;
  
  this_00 = in_RDI;
  ImVector<ImGuiTabItem>::ImVector(in_RDI);
  ImRect::ImRect((ImRect *)this_00);
  in_RDI[1].Size = 0;
  *(undefined4 *)((long)&in_RDI[1].Data + 4) = 0;
  *(undefined4 *)&in_RDI[1].Data = 0;
  in_RDI[1].Capacity = 0;
  in_RDI[2].Capacity = -1;
  in_RDI[2].Size = -1;
  *(undefined4 *)&in_RDI[3].Data = 0;
  in_RDI[4].Size = 0;
  *(undefined4 *)((long)&in_RDI[3].Data + 4) = 0;
  *(undefined4 *)&in_RDI[4].Data = 0;
  in_RDI[4].Capacity = 0;
  *(undefined4 *)((long)&in_RDI[4].Data + 4) = 0;
  in_RDI[5].Size = 0;
  in_RDI[5].Capacity = 0;
  *(undefined1 *)((long)&in_RDI[5].Data + 1) = 0;
  *(undefined1 *)&in_RDI[5].Data = 0;
  *(undefined2 *)((long)&in_RDI[5].Data + 2) = 0xffff;
  return;
}

Assistant:

ImGuiTabBar::ImGuiTabBar()
{
    ID = 0;
    SelectedTabId = NextSelectedTabId = VisibleTabId = 0;
    CurrFrameVisible = PrevFrameVisible = -1;
    ContentsHeight = 0.0f;
    OffsetMax = OffsetNextTab = 0.0f;
    ScrollingAnim = ScrollingTarget = 0.0f;
    Flags = ImGuiTabBarFlags_None;
    ReorderRequestTabId = 0;
    ReorderRequestDir = 0;
    WantLayout = VisibleTabWasSubmitted = false;
    LastTabItemIdx = -1;
}